

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackGenerator::FindTemplate_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackGenerator *this,char *name)

{
  cmCPackLog *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  char *local_1b8 [4];
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCPackLog_msg,"Look for template: ");
  pcVar3 = "(NULL)";
  if (name != (char *)0x0) {
    pcVar3 = name;
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x50c,local_1b8[0]);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  cmMakefile::GetModulesFile_abi_cxx11_(__return_storage_ptr__,this->MakefileMap,name);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCPackLog_msg,"Found template: ");
  poVar2 = std::operator<<(poVar2,(string *)__return_storage_ptr__);
  std::endl<char,std::char_traits<char>>(poVar2);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x50f,local_1b8[0]);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::FindTemplate(const char* name)
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Look for template: "
    << (name ? name : "(NULL)") << std::endl);
  std::string ffile = this->MakefileMap->GetModulesFile(name);
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Found template: "
    << ffile << std::endl);
  return ffile;
}